

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O0

void __thiscall iDynTree::AttitudeQuaternionEKF::AttitudeQuaternionEKF(AttitudeQuaternionEKF *this)

{
  double *pdVar1;
  IAttitudeEstimator *in_RDI;
  AttitudeEstimatorState *in_stack_ffffffffffffff80;
  VectorDynSize *this_00;
  _func_int **local_30;
  _func_int **pp_Stack_28;
  DiscreteExtendedKalmanFilterHelper *in_stack_ffffffffffffffe0;
  
  IAttitudeEstimator::IAttitudeEstimator(in_RDI);
  DiscreteExtendedKalmanFilterHelper::DiscreteExtendedKalmanFilterHelper(in_stack_ffffffffffffffe0);
  in_RDI->_vptr_IAttitudeEstimator = (_func_int **)&PTR__AttitudeQuaternionEKF_006f5bb8;
  in_RDI[1]._vptr_IAttitudeEstimator = (_func_int **)&PTR_ekf_f_006f5c58;
  AttitudeEstimatorState::AttitudeEstimatorState(in_stack_ffffffffffffff80);
  AttitudeEstimatorState::AttitudeEstimatorState(in_stack_ffffffffffffff80);
  AttitudeQuaternionEKFParameters::AttitudeQuaternionEKFParameters
            ((AttitudeQuaternionEKFParameters *)(in_RDI + 0x52));
  iDynTree::Rotation::Rotation((Rotation *)(in_RDI + 0x5c));
  VectorFixSize<3U>::VectorFixSize((VectorFixSize<3U> *)(in_RDI + 0x65));
  VectorFixSize<3U>::VectorFixSize((VectorFixSize<3U> *)(in_RDI + 0x68));
  VectorFixSize<3U>::VectorFixSize((VectorFixSize<3U> *)(in_RDI + 0x6b));
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 0x6f));
  this_00 = (VectorDynSize *)(in_RDI + 0x73);
  iDynTree::VectorDynSize::VectorDynSize(this_00);
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 0x77));
  *(undefined1 *)&in_RDI[0x7e]._vptr_IAttitudeEstimator = 0;
  MatrixFixSize<4U,_4U>::MatrixFixSize((MatrixFixSize<4U,_4U> *)(in_RDI + 0x7f));
  MatrixFixSize<3U,_3U>::MatrixFixSize((MatrixFixSize<3U,_3U> *)(in_RDI + 0x8f));
  Direction::Direction((Direction *)0x620c85);
  VectorFixSize<4U>::zero((VectorFixSize<4U> *)(in_RDI + 0x3e));
  pdVar1 = VectorFixSize<4U>::operator()((VectorFixSize<4U> *)(in_RDI + 0x3e),0);
  *pdVar1 = 1.0;
  VectorFixSize<3U>::zero((VectorFixSize<3U> *)(in_RDI + 0x42));
  VectorFixSize<3U>::zero((VectorFixSize<3U> *)(in_RDI + 0x45));
  in_RDI[0x50]._vptr_IAttitudeEstimator = in_RDI[0x46]._vptr_IAttitudeEstimator;
  in_RDI[0x51]._vptr_IAttitudeEstimator = in_RDI[0x47]._vptr_IAttitudeEstimator;
  in_RDI[0x4e]._vptr_IAttitudeEstimator = in_RDI[0x44]._vptr_IAttitudeEstimator;
  in_RDI[0x4f]._vptr_IAttitudeEstimator = in_RDI[0x45]._vptr_IAttitudeEstimator;
  in_RDI[0x4c]._vptr_IAttitudeEstimator = in_RDI[0x42]._vptr_IAttitudeEstimator;
  in_RDI[0x4d]._vptr_IAttitudeEstimator = in_RDI[0x43]._vptr_IAttitudeEstimator;
  in_RDI[0x4a]._vptr_IAttitudeEstimator = in_RDI[0x40]._vptr_IAttitudeEstimator;
  in_RDI[0x4b]._vptr_IAttitudeEstimator = in_RDI[0x41]._vptr_IAttitudeEstimator;
  in_RDI[0x48]._vptr_IAttitudeEstimator = in_RDI[0x3e]._vptr_IAttitudeEstimator;
  in_RDI[0x49]._vptr_IAttitudeEstimator = in_RDI[0x3f]._vptr_IAttitudeEstimator;
  iDynTree::Rotation::fromQuaternion((VectorFixSize *)(in_RDI + 0x5c));
  iDynTree::Rotation::asRPY();
  in_RDI[0x67]._vptr_IAttitudeEstimator = (_func_int **)in_stack_ffffffffffffffe0;
  in_RDI[0x65]._vptr_IAttitudeEstimator = local_30;
  in_RDI[0x66]._vptr_IAttitudeEstimator = pp_Stack_28;
  VectorFixSize<3U>::zero((VectorFixSize<3U> *)(in_RDI + 0x68));
  VectorFixSize<3U>::zero((VectorFixSize<3U> *)(in_RDI + 0x6b));
  pdVar1 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0x6b),2);
  *pdVar1 = 1.0;
  VectorFixSize<3U>::zero((VectorFixSize<3U> *)(in_RDI + 0x98));
  pdVar1 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0x98),2);
  *pdVar1 = 1.0;
  toEigen<4u,4u>((MatrixFixSize<4U,_4U> *)this_00);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>_>::
  setIdentity((MatrixBase<Eigen::Map<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0,_Eigen::Stride<0,_0>_>_>
               *)0x620e38);
  toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)this_00);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>::
  setIdentity((MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
               *)0x620e5c);
  return;
}

Assistant:

iDynTree::AttitudeQuaternionEKF::AttitudeQuaternionEKF()
{
    m_state_qekf.m_orientation.zero();
    m_state_qekf.m_orientation(0) = 1.0;
    m_state_qekf.m_angular_velocity.zero();
    m_state_qekf.m_gyroscope_bias.zero();

    m_initial_state_qekf = m_state_qekf;
    m_orientationInSO3.fromQuaternion(m_state_qekf.m_orientation);
    m_orientationInRPY = m_orientationInSO3.asRPY();

    m_Omega_y.zero();
    m_Acc_y.zero();
    m_Acc_y(2) = 1; // TODO: validate this assumption at initial step

    m_gravity_direction.zero();
    m_gravity_direction(2) = 1;

    using iDynTree::toEigen;
    toEigen(m_Id4).setIdentity();
    toEigen(m_Id3).setIdentity();
}